

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

void mod2dense_print(FILE *f,mod2dense *m)

{
  uint uVar1;
  int row;
  int col;
  
  if (0 < m->n_rows) {
    row = 0;
    do {
      if (0 < m->n_cols) {
        col = 0;
        do {
          uVar1 = mod2dense_get(m,row,col);
          fprintf((FILE *)f," %d",(ulong)uVar1);
          col = col + 1;
        } while (col < m->n_cols);
      }
      fputc(10,(FILE *)f);
      row = row + 1;
    } while (row < m->n_rows);
  }
  return;
}

Assistant:

void mod2dense_print     
( FILE *f,
  mod2dense *m
)
{ 
  int i, j;

  for (i = 0; i<mod2dense_rows(m); i++)
  { for (j = 0; j<mod2dense_cols(m); j++)
    { fprintf(f," %d",mod2dense_get(m,i,j));
    }
    fprintf(f,"\n");
  }
}